

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xpath_query::xpath_query(xpath_query *this,xpath_query *rhs)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  xpath_parse_result local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  xpath_parse_result::xpath_parse_result((xpath_parse_result *)(in_RDI + 1));
  *in_RDI = *local_10;
  uVar1 = local_10[2];
  in_RDI[1] = local_10[1];
  in_RDI[2] = uVar1;
  *local_10 = 0;
  xpath_parse_result::xpath_parse_result(&local_20);
  local_10[1] = local_20.error;
  local_10[2] = local_20.offset;
  return;
}

Assistant:

PUGI__FN xpath_query::xpath_query(xpath_query&& rhs) PUGIXML_NOEXCEPT
	{
		_impl = rhs._impl;
		_result = rhs._result;
		rhs._impl = 0;
		rhs._result = xpath_parse_result();
	}